

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O1

int pmx::ReadIndex(istream *stream,int size)

{
  uint uVar1;
  bool bVar2;
  uint8_t tmp8;
  uint16_t tmp16;
  int tmp32;
  byte local_f;
  ushort local_e;
  uint local_c;
  
  if (size == 4) {
    std::istream::read((char *)stream,(long)&local_c);
  }
  else {
    if (size == 2) {
      std::istream::read((char *)stream,(long)&local_e);
      uVar1 = (uint)local_e;
      bVar2 = local_e == 0xffff;
    }
    else {
      if (size != 1) {
        return -1;
      }
      std::istream::read((char *)stream,(long)&local_f);
      uVar1 = (uint)local_f;
      bVar2 = local_f == 0xff;
    }
    local_c = 0xffffffff;
    if (!bVar2) {
      local_c = uVar1;
    }
  }
  return local_c;
}

Assistant:

int ReadIndex(std::istream *stream, int size)
	{
		switch (size)
		{
		case 1:
			uint8_t tmp8;
			stream->read((char*) &tmp8, sizeof(uint8_t));
			if (255 == tmp8)
			{
				return -1;
			}
			else {
				return (int) tmp8;
			}
		case 2:
			uint16_t tmp16;
			stream->read((char*) &tmp16, sizeof(uint16_t));
			if (65535 == tmp16)
			{
				return -1;
			}
			else {
				return (int) tmp16;
			}
		case 4:
			int tmp32;
			stream->read((char*) &tmp32, sizeof(int));
			return tmp32;
		default:
			return -1;
		}
	}